

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool __thiscall
ON_Font::Internal_SetFontCharacteristicsFromUnsigned
          (ON_Font *this,uint font_characteristics_as_unsigned)

{
  bool bUnderlined_00;
  Style font_style_00;
  Stretch font_stretch_00;
  Weight font_weight_00;
  bool bVar1;
  byte bVar2;
  wchar_t *face_name;
  ON_wString *src;
  double in_XMM1_Qa;
  bool bStrikethrough;
  bool bUnderlined;
  Style font_style;
  Stretch font_stretch;
  Weight font_weight;
  ON_wString windows_logfont_name;
  
  font_weight = Normal;
  font_stretch = Medium;
  font_style = Upright;
  bUnderlined = false;
  bStrikethrough = false;
  Internal_GetFontCharacteristicsFromUnsigned
            (font_characteristics_as_unsigned,&font_weight,&font_stretch,&font_style,&bUnderlined,
             &bStrikethrough);
  bVar1 = ON_wString::IsNotEmpty(&this->m_loc_windows_logfont_name);
  src = &this->m_en_windows_logfont_name;
  if (bVar1) {
    src = &this->m_loc_windows_logfont_name;
  }
  ON_wString::ON_wString(&windows_logfont_name,src);
  face_name = ON_wString::operator_cast_to_wchar_t_(&windows_logfont_name);
  font_weight_00 = font_weight;
  font_stretch_00 = font_stretch;
  font_style_00 = font_style;
  bUnderlined_00 = bUnderlined;
  bVar1 = bStrikethrough;
  bVar2 = WindowsLogfontCharSetFromFaceName(face_name);
  bVar1 = SetFontCharacteristics
                    (this,0.0,face_name,font_weight_00,font_style_00,font_stretch_00,bUnderlined_00,
                     bVar1,in_XMM1_Qa,(uint)bVar2);
  ON_wString::~ON_wString(&windows_logfont_name);
  return bVar1;
}

Assistant:

bool ON_Font::Internal_SetFontCharacteristicsFromUnsigned(
  unsigned int font_characteristics_as_unsigned
  )
{
  ON_Font::Weight font_weight = ON_Font::Weight::Normal;
  ON_Font::Stretch font_stretch = ON_Font::Stretch::Medium;
  ON_Font::Style font_style = ON_Font::Style::Upright;
  bool bUnderlined = false;
  bool bStrikethrough = false;

  ON_Font::Internal_GetFontCharacteristicsFromUnsigned(
    font_characteristics_as_unsigned,
    font_weight,
    font_stretch,
    font_style,
    bUnderlined,
    bStrikethrough
    );


  const ON_wString windows_logfont_name = WindowsLogfontName();

  bool rc = SetFontCharacteristics(
    windows_logfont_name,
    font_weight,
    font_style,
    font_stretch,
    bUnderlined,
    bStrikethrough
  );

  return rc;
}